

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall
Shell::Options::strategySamplingAssign
          (Options *this,string *optname,string *value,
          DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
          *fakes)

{
  bool bVar1;
  char *pcVar2;
  AbstractOptionValue *this_00;
  UserErrorException *pUVar3;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Options *in_RDI;
  AbstractOptionValue *opt;
  undefined2 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffeca;
  undefined4 in_stack_fffffffffffffecb;
  undefined4 uVar4;
  undefined1 in_stack_fffffffffffffecf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  _Alloc_hider in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  if (*pcVar2 == '$') {
    std::__cxx11::string::string((string *)&local_f0,(string *)in_RSI);
    std::__cxx11::string::string((string *)&local_110,(string *)in_RDX);
    ::Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::set(in_RCX,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)in_RSI);
    this_00 = getOptionValueByName(in_RDI,(string *)in_stack_ffffffffffffff40._M_p);
    std::__cxx11::string::~string(local_40);
    if (this_00 == (AbstractOptionValue *)0x0) {
      pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff40,"Sampling file processing error -- unknown option: ",
                     in_RSI);
      ::Lib::UserErrorException::Exception(pUVar3,(string *)&stack0xffffffffffffff40);
      __cxa_throw(pUVar3,&::Lib::UserErrorException::typeinfo,
                  ::Lib::UserErrorException::~UserErrorException);
    }
    bVar1 = AbstractOptionValue::set
                      (this_00,in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
    if (!bVar1) {
      uVar4 = CONCAT31((int3)((uint)in_stack_fffffffffffffecb >> 8),1);
      pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_a0,"Sampling file processing error -- unknown option value: ",in_RDX);
      std::operator+(in_stack_fffffffffffffed0,
                     (char *)CONCAT17(in_stack_fffffffffffffecf,
                                      CONCAT43(uVar4,CONCAT12(in_stack_fffffffffffffeca,
                                                              in_stack_fffffffffffffec8))));
      std::operator+(&local_60,&local_80,in_RSI);
      ::Lib::UserErrorException::Exception(pUVar3,&local_60);
      __cxa_throw(pUVar3,&::Lib::UserErrorException::typeinfo,
                  ::Lib::UserErrorException::~UserErrorException);
    }
  }
  return;
}

Assistant:

void Options::strategySamplingAssign(std::string optname, std::string value, DHMap<std::string,std::string>& fakes)
{
  // dollar sign signifies fake options
  if (optname[0] == '$') {
    fakes.set(optname,value);
    return;
  }

  AbstractOptionValue* opt = getOptionValueByName(optname);
  if (opt) {
    if (!opt->set(value,/* dont_touch_if_defaulting =*/ true)) {
      USER_ERROR("Sampling file processing error -- unknown option value: " + value + " for option " + optname);
    }

  } else {
    USER_ERROR("Sampling file processing error -- unknown option: " + optname);
  }
}